

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_message.c
# Opt level: O0

char * IoTHubMessage_GetString(IOTHUB_MESSAGE_HANDLE iotHubMessageHandle)

{
  IOTHUB_MESSAGE_HANDLE_DATA *handleData;
  char *result;
  IOTHUB_MESSAGE_HANDLE iotHubMessageHandle_local;
  
  if (iotHubMessageHandle == (IOTHUB_MESSAGE_HANDLE)0x0) {
    handleData = (IOTHUB_MESSAGE_HANDLE_DATA *)0x0;
  }
  else if (iotHubMessageHandle->contentType == IOTHUBMESSAGE_STRING) {
    handleData = (IOTHUB_MESSAGE_HANDLE_DATA *)STRING_c_str((iotHubMessageHandle->value).string);
  }
  else {
    handleData = (IOTHUB_MESSAGE_HANDLE_DATA *)0x0;
  }
  return (char *)handleData;
}

Assistant:

const char* IoTHubMessage_GetString(IOTHUB_MESSAGE_HANDLE iotHubMessageHandle)
{
    const char* result;
    if (iotHubMessageHandle == NULL)
    {
        result = NULL;
    }
    else
    {
        IOTHUB_MESSAGE_HANDLE_DATA* handleData = iotHubMessageHandle;
        if (handleData->contentType != IOTHUBMESSAGE_STRING)
        {
            result = NULL;
        }
        else
        {
            result = STRING_c_str(handleData->value.string);
        }
    }
    return result;
}